

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parseStack.c
# Opt level: O3

Parse_StackFn_t * Parse_StackFnStart(int nDepth)

{
  Parse_StackFn_t *pPVar1;
  void **ppvVar2;
  
  pPVar1 = (Parse_StackFn_t *)calloc(1,0x10);
  ppvVar2 = (void **)malloc((long)nDepth * 8);
  pPVar1->pData = ppvVar2;
  pPVar1->Size = nDepth;
  return pPVar1;
}

Assistant:

Parse_StackFn_t * Parse_StackFnStart( int nDepth )
{
    Parse_StackFn_t * p;
    p = ABC_ALLOC( Parse_StackFn_t, 1 );
    memset( p, 0, sizeof(Parse_StackFn_t) );
    p->pData = ABC_ALLOC( void *, nDepth );
    p->Size = nDepth;
    return p;
}